

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

shared_ptr<ot::commissioner::Commissioner> __thiscall
ot::commissioner::Commissioner::Create(Commissioner *this,CommissionerHandler *aHandler)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ot::commissioner::Commissioner> sVar1;
  shared_ptr<ot::commissioner::CommissionerSafe> local_28;
  CommissionerHandler *local_18;
  CommissionerHandler *aHandler_local;
  
  local_18 = aHandler;
  aHandler_local = (CommissionerHandler *)this;
  std::make_shared<ot::commissioner::CommissionerSafe,ot::commissioner::CommissionerHandler&>
            ((CommissionerHandler *)&local_28);
  std::shared_ptr<ot::commissioner::Commissioner>::
  shared_ptr<ot::commissioner::CommissionerSafe,void>
            ((shared_ptr<ot::commissioner::Commissioner> *)this,&local_28);
  std::shared_ptr<ot::commissioner::CommissionerSafe>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<ot::commissioner::Commissioner>)
         sVar1.super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Commissioner> Commissioner::Create(CommissionerHandler &aHandler)
{
    return std::make_shared<CommissionerSafe>(aHandler);
}